

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# S2_easy.cpp
# Opt level: O1

int256_t * __thiscall
primesum::S2_easy(int256_t *__return_storage_ptr__,primesum *this,int128_t x,int64_t y,int64_t z,
                 int64_t c,int threads)

{
  pointer pcVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 x_00 [16];
  undefined1 n [16];
  undefined1 x_01 [16];
  undefined1 n_00 [16];
  undefined1 x_02 [16];
  undefined1 n_01 [16];
  undefined1 limit [16];
  undefined1 limit_00 [16];
  undefined1 limit_01 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  pointer plVar31;
  pointer p_Var32;
  ulong uVar33;
  pointer pPVar34;
  pointer pPVar35;
  ulong uVar36;
  uint uVar37;
  ulong uVar38;
  ulong uVar39;
  ulong uVar40;
  ulong uVar41;
  ulong uVar42;
  pointer pPVar43;
  int iVar44;
  ulong uVar45;
  undefined4 in_register_0000008c;
  long lVar46;
  long lVar47;
  long lVar48;
  ulong uVar49;
  ulong uVar50;
  pointer pPVar51;
  bool bVar52;
  bool bVar53;
  bool bVar54;
  undefined4 uVar55;
  double dVar56;
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  PiTable pi_2;
  S2Status status;
  vector<long,_std::allocator<long>_> primes;
  vector<__int128,_std::allocator<__int128>_> prime_sums;
  int256_t phi_xn_sum;
  PiTable pi;
  undefined8 in_stack_fffffffffffffe08;
  undefined8 in_stack_fffffffffffffe10;
  undefined8 in_stack_fffffffffffffe18;
  undefined8 in_stack_fffffffffffffe20;
  pointer local_198;
  pointer local_190;
  pointer pPStack_188;
  pointer local_180;
  ulong local_178;
  ulong local_170;
  ulong local_168;
  undefined1 local_160 [40];
  vector<long,_std::allocator<long>_> local_138;
  ulong local_120;
  int256_t *local_118;
  long local_110;
  ulong local_108;
  pointer local_100;
  pointer local_f8;
  vector<__int128,_std::allocator<__int128>_> local_f0;
  int256_t local_d8;
  int256_t local_b8;
  PiTable local_90;
  int64_t local_70;
  double local_68;
  long local_60;
  int256_t local_58;
  
  uVar42 = CONCAT44(in_register_0000008c,threads);
  pcVar1 = local_160 + 0x10;
  local_160._0_8_ = pcVar1;
  local_118 = __return_storage_ptr__;
  local_70 = c;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_160,"");
  print((string *)local_160);
  if ((pointer)local_160._0_8_ != pcVar1) {
    operator_delete((void *)local_160._0_8_,local_160._16_8_ + 1);
  }
  local_160._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_160,"=== S2_easy(x, y) ===","");
  print((string *)local_160);
  if ((pointer)local_160._0_8_ != pcVar1) {
    operator_delete((void *)local_160._0_8_,local_160._16_8_ + 1);
  }
  local_160._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_160,"Computation of the easy special leaves","");
  print((string *)local_160);
  if ((pointer)local_160._0_8_ != pcVar1) {
    operator_delete((void *)local_160._0_8_,local_160._16_8_ + 1);
  }
  auVar60._8_8_ = in_stack_fffffffffffffe10;
  auVar60._0_8_ = in_stack_fffffffffffffe08;
  print(this,(int128_t)auVar60,y,z,threads);
  local_68 = get_time();
  *(undefined8 *)&local_118->low = 0;
  *(undefined8 *)((long)&local_118->low + 8) = 0;
  *(undefined8 *)&local_118->high = 0;
  *(undefined8 *)((long)&local_118->high + 8) = 0;
  if (z < 0x100000000) {
    generate_primes<unsigned_int>
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_138,z);
    generate_prime_sums<unsigned_long>
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_f0,z);
    dVar56 = (double)__floatuntidf(this,y);
    dVar56 = pow(dVar56,0.3333333333333333);
    auVar58 = __fixunsdfti(SUB84(dVar56,0));
    if (y < 1) {
      if (auVar58._0_8_ != 0 || auVar58._8_8_ != 0) {
        do {
          lVar47 = auVar58._0_8_;
          iVar44 = 2;
          auVar60 = ZEXT816(1);
          do {
            auVar60 = auVar58 * auVar60;
            iVar44 = iVar44 + -1;
          } while (iVar44 != 0);
          auVar59 = __udivti3(this,y,lVar47,auVar58._8_8_);
          if (auVar60._8_8_ <= auVar59._8_8_ &&
              (ulong)(auVar59._0_8_ < auVar60._0_8_) <= auVar59._8_8_ - auVar60._8_8_)
          goto LAB_0012343d;
          lVar46 = auVar58._8_8_ + -1 + (ulong)(lVar47 != 0);
          auVar58._8_8_ = lVar46;
          auVar58._0_8_ = lVar47 + -1;
        } while (lVar47 + -1 != 0 || lVar46 != 0);
        auVar58 = ZEXT816(0);
      }
LAB_0012343d:
      do {
        auVar60 = auVar58;
        uVar49 = auVar60._0_8_;
        uVar50 = uVar49 + 1;
        lVar47 = auVar60._8_8_ + (ulong)(0xfffffffffffffffe < uVar49);
        auVar58._8_8_ = lVar47;
        auVar58._0_8_ = uVar50;
        iVar44 = 2;
        uVar40 = 0;
        uVar41 = 1;
        do {
          auVar59._8_8_ = 0;
          auVar59._0_8_ = uVar41;
          auVar15._8_8_ = 0;
          auVar15._0_8_ = uVar50;
          uVar33 = SUB168(auVar59 * auVar15,0);
          uVar40 = uVar40 * uVar50 + uVar41 * lVar47 + SUB168(auVar59 * auVar15,8);
          iVar44 = iVar44 + -1;
          uVar41 = uVar33;
        } while (iVar44 != 0);
        auVar59 = __udivti3(this,y,uVar50,lVar47);
      } while (uVar40 <= auVar59._8_8_ && (ulong)(auVar59._0_8_ < uVar33) <= auVar59._8_8_ - uVar40)
      ;
      ideal_num_threads((int)x,uVar49,1000);
      PiTable::PiTable((PiTable *)&local_198,z);
      dVar56 = (double)z;
      if (dVar56 < 0.0) {
        dVar56 = sqrt(dVar56);
      }
      else {
        dVar56 = SQRT(dVar56);
      }
      uVar41 = 0xb504f333;
      if ((long)dVar56 < 0xb504f333) {
        uVar41 = (long)dVar56;
      }
      lVar47 = uVar41 * 2;
      do {
        lVar46 = uVar41 * uVar41;
        uVar41 = uVar41 - 1;
        lVar47 = lVar47 + -2;
      } while (lVar46 - z != 0 && z <= lVar46);
      do {
        uVar41 = uVar41 + 1;
        lVar47 = lVar47 + 2;
      } while (lVar47 < (long)(z - uVar41 * uVar41));
      uVar40 = uVar41 >> 2 & 0xfffffffffffffff0;
      lVar47 = *(long *)((long)&local_198->prime_count + uVar40);
      uVar49 = uVar49 >> 2 & 0xfffffffffffffff0;
      lVar46 = *(long *)((long)&local_198->bits + uVar40);
      lVar48 = POPCOUNT((ulong)(*(long *)((long)&local_198->bits + uVar49) << (~auVar60[0] & 0x3f))
                        >> (~auVar60[0] & 0x3f)) + *(long *)((long)&local_198->prime_count + uVar49)
      ;
      x_02._8_8_ = in_stack_fffffffffffffe10;
      x_02._0_8_ = in_stack_fffffffffffffe08;
      S2Status::S2Status((S2Status *)local_160,(int128_t)x_02);
      uVar41 = POPCOUNT((ulong)(lVar46 << (~(byte)uVar41 & 0x3f)) >> (~(byte)uVar41 & 0x3f)) +
               lVar47;
      if ((long)uVar41 <= (long)uVar42) {
        uVar41 = uVar42;
      }
      if ((long)uVar41 < lVar48) {
        local_60 = lVar48 >> 0x3f;
        auVar25 = ZEXT816(0);
        local_120 = z >> 0x3f;
        local_110 = lVar48;
        do {
          uVar33 = CONCAT44(0,*(uint *)((long)local_138.
                                              super__Vector_base<long,_std::allocator<long>_>.
                                              _M_impl.super__Vector_impl_data._M_start +
                                       uVar41 * 4 + 4));
          local_170 = uVar41;
          auVar60 = __udivti3(this,y,uVar33,0);
          uVar50 = auVar60._8_8_;
          uVar49 = auVar60._0_8_;
          auVar58 = __udivti3(uVar49,uVar50,uVar33,0);
          uVar42 = (ulong)(auVar58._0_8_ < (ulong)z);
          uVar41 = auVar58._8_8_ - local_120;
          uVar40 = auVar58._0_8_;
          if (local_120 <= auVar58._8_8_ && uVar42 <= uVar41) {
            uVar40 = z;
          }
          dVar56 = (double)__floatuntidf(uVar49,uVar50,uVar41 - uVar42);
          if (dVar56 < 0.0) {
            dVar56 = sqrt(dVar56);
            uVar55 = SUB84(dVar56,0);
          }
          else {
            uVar55 = SUB84(SQRT(dVar56),0);
          }
          uVar42 = local_170;
          local_108 = local_170 + 1;
          auVar58 = __fixunsdfti(uVar55);
          p_Var32 = local_f0.super__Vector_base<__int128,_std::allocator<__int128>_>._M_impl.
                    super__Vector_impl_data._M_start;
          plVar31 = local_138.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                    super__Vector_impl_data._M_start;
          pPVar43 = local_198;
          lVar47 = 0;
          uVar41 = -(ulong)(auVar58._8_8_ != 0) | auVar58._0_8_;
          do {
            lVar46 = lVar47;
            auVar8._8_8_ = 0;
            auVar8._0_8_ = uVar41;
            auVar20._8_8_ = 0;
            auVar20._0_8_ = uVar41;
            uVar39 = SUB168(auVar8 * auVar20,8) + uVar41 * lVar46 * 2;
            uVar36 = uVar41;
            lVar47 = lVar46 + -1 + (ulong)(uVar41 != 0);
            uVar41 = uVar41 - 1;
          } while (uVar50 < uVar39 || uVar50 - uVar39 < (ulong)(uVar49 < SUB168(auVar8 * auVar20,0))
                  );
          do {
            uVar39 = uVar36;
            auVar9._8_8_ = 0;
            auVar9._0_8_ = uVar39;
            auVar21._8_8_ = 0;
            auVar21._0_8_ = uVar39;
            auVar30._8_8_ = SUB168(auVar9 * auVar21,8) + uVar39 * lVar46 * 2;
            auVar30._0_8_ = SUB168(auVar9 * auVar21,0);
            uVar41 = SUB168(auVar60 - auVar30,8);
            uVar38 = lVar46 << 1 | uVar39 >> 0x3f;
            lVar46 = lVar46 + (ulong)(0xfffffffffffffffe < uVar39);
            uVar36 = uVar39 + 1;
          } while (uVar38 < uVar41 ||
                   uVar38 - uVar41 < (ulong)(uVar39 * 2 < SUB168(auVar60 - auVar30,0)));
          uVar36 = local_70 / (long)uVar33;
          uVar41 = z / (long)uVar33;
          if (z / (long)uVar33 <= (long)uVar33) {
            uVar41 = uVar33;
          }
          local_178 = z;
          if ((long)uVar39 < z) {
            local_178 = uVar39;
          }
          if ((long)uVar39 < (long)uVar41) {
            local_178 = uVar41;
          }
          uVar39 = z;
          if ((long)uVar36 < z) {
            uVar39 = uVar36;
          }
          if ((long)uVar36 < (long)uVar41) {
            uVar39 = uVar41;
          }
          uVar41 = uVar40 >> 2 & 0xfffffffffffffff0;
          lVar47 = POPCOUNT((ulong)(*(long *)((long)&local_198->bits + uVar41) <<
                                   (~(byte)uVar40 & 0x3f)) >> (~(byte)uVar40 & 0x3f)) +
                   *(long *)((long)&local_198->prime_count + uVar41);
          uVar41 = local_178 >> 2 & 0xfffffffffffffff0;
          local_f8 = (pointer)(POPCOUNT((ulong)(*(long *)((long)&local_198->bits + uVar41) <<
                                               (~(byte)local_178 & 0x3f)) >>
                                        (~(byte)local_178 & 0x3f)) +
                              *(long *)((long)&local_198->prime_count + uVar41));
          uVar41 = uVar39 >> 2 & 0xfffffffffffffff0;
          local_168 = POPCOUNT((ulong)(*(long *)((long)&local_198->bits + uVar41) <<
                                      (~(byte)uVar39 & 0x3f)) >> (~(byte)uVar39 & 0x3f)) +
                      *(long *)((long)&local_198->prime_count + uVar41);
          if ((long)local_f8 < lVar47) {
            local_100 = *(pointer *)
                         ((long)local_f0.super__Vector_base<__int128,_std::allocator<__int128>_>.
                                _M_impl.super__Vector_impl_data._M_start + uVar42 * 8);
            lVar46 = lVar47;
            do {
              uVar42 = (ulong)*(uint *)((long)plVar31 + lVar46 * 4);
              if (uVar50 == 0) {
                uVar42 = uVar49 / uVar42;
              }
              else {
                uVar42 = __udivti3(uVar49,uVar50,uVar42,0);
              }
              uVar41 = uVar42 >> 2 & 0xfffffffffffffff0;
              lVar47 = POPCOUNT((ulong)(*(long *)((long)&pPVar43->bits + uVar41) <<
                                       (~(byte)uVar42 & 0x3f)) >> (~(byte)uVar42 & 0x3f)) +
                       *(long *)((long)&pPVar43->prime_count + uVar41);
              lVar48 = *(long *)((long)p_Var32 + lVar47 * 8);
              uVar42 = (ulong)*(uint *)((long)plVar31 + lVar47 * 4 + 4);
              if (uVar50 == 0) {
                uVar42 = uVar49 / uVar42;
              }
              else {
                uVar42 = __udivti3(uVar49,uVar50,uVar42,0);
              }
              if ((long)uVar42 <= (long)local_178) {
                uVar42 = local_178;
              }
              uVar41 = uVar42 >> 2 & 0xfffffffffffffff0;
              lVar47 = POPCOUNT((ulong)(*(long *)((long)&pPVar43->bits + uVar41) <<
                                       (~(byte)uVar42 & 0x3f)) >> (~(byte)uVar42 & 0x3f)) +
                       *(long *)((long)&pPVar43->prime_count + uVar41);
              auVar10._8_8_ = 0;
              auVar10._0_8_ = (lVar48 - (long)local_100) + 1;
              auVar22._8_8_ = 0;
              auVar22._0_8_ = uVar33;
              uVar42 = *(long *)((long)p_Var32 + lVar46 * 8) - *(long *)((long)p_Var32 + lVar47 * 8)
              ;
              auVar11._8_8_ = 0;
              auVar11._0_8_ = SUB168(auVar10 * auVar22,0);
              auVar23._8_8_ = 0;
              auVar23._0_8_ = uVar42;
              auVar27._8_8_ = SUB168(auVar11 * auVar23,8) + SUB168(auVar10 * auVar22,8) * uVar42;
              auVar27._0_8_ = SUB168(auVar11 * auVar23,0);
              auVar25 = auVar25 + auVar27;
              lVar46 = lVar47;
            } while ((long)local_f8 < lVar47);
          }
          p_Var32 = local_f0.super__Vector_base<__int128,_std::allocator<__int128>_>._M_impl.
                    super__Vector_impl_data._M_start;
          plVar31 = local_138.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                    super__Vector_impl_data._M_start;
          if ((long)local_168 < lVar47) {
            lVar46 = *(long *)((long)local_f0.
                                     super__Vector_base<__int128,_std::allocator<__int128>_>._M_impl
                                     .super__Vector_impl_data._M_start + local_170 * 8);
            do {
              uVar42 = (ulong)*(uint *)((long)plVar31 + lVar47 * 4);
              if (uVar50 == 0) {
                uVar41 = uVar49 / uVar42;
              }
              else {
                uVar41 = __udivti3(uVar49,uVar50,uVar42,0);
              }
              uVar40 = uVar41 >> 2 & 0xfffffffffffffff0;
              auVar12._8_8_ = 0;
              auVar12._0_8_ =
                   (*(long *)((long)p_Var32 +
                             (POPCOUNT((ulong)(*(long *)((long)&pPVar43->bits + uVar40) <<
                                              (~(byte)uVar41 & 0x3f)) >> (~(byte)uVar41 & 0x3f)) +
                             *(long *)((long)&pPVar43->prime_count + uVar40)) * 8) - lVar46) + 1;
              auVar24._8_8_ = 0;
              auVar24._0_8_ = uVar42 * uVar33;
              auVar25 = auVar12 * auVar24 + auVar25;
              lVar47 = lVar47 + -1;
            } while ((long)local_168 < lVar47);
          }
          bVar52 = is_print();
          uVar41 = local_108;
          lVar47 = local_110;
          if (bVar52) {
            n_01._8_8_ = in_stack_fffffffffffffe10;
            n_01._0_8_ = in_stack_fffffffffffffe08;
            limit_01._8_8_ = in_stack_fffffffffffffe20;
            limit_01._0_8_ = in_stack_fffffffffffffe18;
            S2Status::print((S2Status *)local_160,(int128_t)n_01,(int128_t)limit_01);
          }
        } while ((long)uVar41 < lVar47);
      }
      else {
        auVar25 = ZEXT816(0);
      }
      if (local_198 != (pointer)0x0) {
        operator_delete(local_198,(long)pPStack_188 - (long)local_198);
      }
      uVar42 = 0;
      lVar47 = 0;
    }
    else {
      if (auVar58._0_8_ != 0 || auVar58._8_8_ != 0) {
        do {
          lVar47 = auVar58._0_8_;
          iVar44 = 2;
          auVar60 = ZEXT816(1);
          do {
            auVar60 = auVar58 * auVar60;
            iVar44 = iVar44 + -1;
          } while (iVar44 != 0);
          auVar59 = __udivti3(this,y,lVar47,auVar58._8_8_);
          if (auVar60._8_8_ <= auVar59._8_8_ &&
              (ulong)(auVar59._0_8_ < auVar60._0_8_) <= auVar59._8_8_ - auVar60._8_8_)
          goto LAB_00123340;
          lVar46 = auVar58._8_8_ + -1 + (ulong)(lVar47 != 0);
          auVar58._8_8_ = lVar46;
          auVar58._0_8_ = lVar47 + -1;
        } while (lVar47 + -1 != 0 || lVar46 != 0);
        auVar58 = ZEXT816(0);
      }
LAB_00123340:
      do {
        auVar60 = auVar58;
        uVar49 = auVar60._0_8_;
        uVar50 = uVar49 + 1;
        lVar47 = auVar60._8_8_ + (ulong)(0xfffffffffffffffe < uVar49);
        auVar58._8_8_ = lVar47;
        auVar58._0_8_ = uVar50;
        iVar44 = 2;
        uVar40 = 0;
        uVar41 = 1;
        do {
          auVar3._8_8_ = 0;
          auVar3._0_8_ = uVar41;
          auVar14._8_8_ = 0;
          auVar14._0_8_ = uVar50;
          uVar33 = SUB168(auVar3 * auVar14,0);
          uVar40 = uVar40 * uVar50 + uVar41 * lVar47 + SUB168(auVar3 * auVar14,8);
          iVar44 = iVar44 + -1;
          uVar41 = uVar33;
        } while (iVar44 != 0);
        auVar59 = __udivti3(this,y,uVar50,lVar47);
      } while (uVar40 <= auVar59._8_8_ && (ulong)(auVar59._0_8_ < uVar33) <= auVar59._8_8_ - uVar40)
      ;
      ideal_num_threads((int)x,uVar49,1000);
      PiTable::PiTable(&local_90,z);
      dVar56 = (double)z;
      if (dVar56 < 0.0) {
        dVar56 = sqrt(dVar56);
      }
      else {
        dVar56 = SQRT(dVar56);
      }
      uVar41 = 0xb504f333;
      if ((long)dVar56 < 0xb504f333) {
        uVar41 = (long)dVar56;
      }
      lVar47 = uVar41 * 2;
      do {
        lVar46 = uVar41 * uVar41;
        uVar41 = uVar41 - 1;
        lVar47 = lVar47 + -2;
      } while (lVar46 - z != 0 && z <= lVar46);
      do {
        uVar41 = uVar41 + 1;
        lVar47 = lVar47 + 2;
      } while (lVar47 < (long)(z - uVar41 * uVar41));
      uVar40 = uVar41 >> 2 & 0xfffffffffffffff0;
      lVar47 = *(long *)((long)&(local_90.pi_.
                                 super__Vector_base<primesum::PiTable::PiData,_std::allocator<primesum::PiTable::PiData>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->prime_count + uVar40);
      uVar49 = uVar49 >> 2 & 0xfffffffffffffff0;
      lVar46 = *(long *)((long)&(local_90.pi_.
                                 super__Vector_base<primesum::PiTable::PiData,_std::allocator<primesum::PiTable::PiData>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->bits + uVar40);
      lVar48 = POPCOUNT((ulong)(*(long *)((long)&(local_90.pi_.
                                                  super__Vector_base<primesum::PiTable::PiData,_std::allocator<primesum::PiTable::PiData>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->bits +
                                         uVar49) << (~auVar60[0] & 0x3f)) >> (~auVar60[0] & 0x3f)) +
               *(long *)((long)&(local_90.pi_.
                                 super__Vector_base<primesum::PiTable::PiData,_std::allocator<primesum::PiTable::PiData>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->prime_count + uVar49);
      x_01._8_8_ = in_stack_fffffffffffffe10;
      x_01._0_8_ = in_stack_fffffffffffffe08;
      S2Status::S2Status((S2Status *)local_160,(int128_t)x_01);
      uVar41 = POPCOUNT((ulong)(lVar46 << (~(byte)uVar41 & 0x3f)) >> (~(byte)uVar41 & 0x3f)) +
               lVar47;
      if ((long)uVar41 <= (long)uVar42) {
        uVar41 = uVar42;
      }
      uVar49 = 0;
      uVar40 = 0;
      uVar42 = 0;
      lVar47 = 0;
      if ((long)uVar41 < lVar48) {
        local_120 = lVar48 >> 0x3f;
        uVar42 = 0;
        lVar47 = 0;
        uVar49 = 0;
        uVar40 = 0;
        local_110 = lVar48;
        local_108 = z >> 0x3f;
        do {
          pPVar43 = (pointer)(ulong)*(uint *)((long)local_138.
                                                    super__Vector_base<long,_std::allocator<long>_>.
                                                    _M_impl.super__Vector_impl_data._M_start +
                                             uVar41 * 4 + 4);
          auVar60 = __udivti3(this,y,pPVar43,0);
          uVar38 = auVar60._8_8_;
          uVar39 = auVar60._0_8_;
          auVar58 = __udivti3(uVar39,uVar38,pPVar43,0);
          uVar50 = (ulong)(auVar58._0_8_ < (ulong)z);
          uVar33 = auVar58._8_8_ - local_108;
          uVar36 = auVar58._0_8_;
          if (local_108 <= auVar58._8_8_ && uVar50 <= uVar33) {
            uVar36 = z;
          }
          dVar56 = (double)__floatuntidf(uVar39,uVar38,uVar33 - uVar50);
          if (dVar56 < 0.0) {
            dVar56 = sqrt(dVar56);
            uVar55 = SUB84(dVar56,0);
          }
          else {
            uVar55 = SUB84(SQRT(dVar56),0);
          }
          auVar58 = __fixunsdfti(uVar55);
          lVar46 = 0;
          pPVar51 = (pointer)(-(ulong)(auVar58._8_8_ != 0) | auVar58._0_8_);
          do {
            lVar48 = lVar46;
            auVar6._8_8_ = 0;
            auVar6._0_8_ = pPVar51;
            auVar18._8_8_ = 0;
            auVar18._0_8_ = pPVar51;
            uVar50 = SUB168(auVar6 * auVar18,8) + (long)pPVar51 * lVar48 * 2;
            pPVar35 = pPVar51;
            lVar46 = lVar48 + -1 + (ulong)(pPVar51 != (pointer)0x0);
            pPVar51 = (pointer)((long)&pPVar51[-1].bits + 7);
          } while (uVar38 < uVar50 || uVar38 - uVar50 < (ulong)(uVar39 < SUB168(auVar6 * auVar18,0))
                  );
          do {
            pPVar51 = pPVar35;
            auVar7._8_8_ = 0;
            auVar7._0_8_ = pPVar51;
            auVar19._8_8_ = 0;
            auVar19._0_8_ = pPVar51;
            auVar29._8_8_ = SUB168(auVar7 * auVar19,8) + (long)pPVar51 * lVar48 * 2;
            auVar29._0_8_ = SUB168(auVar7 * auVar19,0);
            uVar50 = SUB168(auVar60 - auVar29,8);
            uVar33 = lVar48 << 1 | (ulong)pPVar51 >> 0x3f;
            lVar48 = lVar48 + (ulong)((pointer)0xfffffffffffffffe < pPVar51);
            pPVar35 = (pointer)((long)&pPVar51->prime_count + 1);
          } while (uVar33 < uVar50 ||
                   uVar33 - uVar50 <
                   (ulong)((ulong)((long)pPVar51 * 2) < SUB168(auVar60 - auVar29,0)));
          pPVar34 = (pointer)(local_70 / (long)pPVar43);
          pPVar35 = (pointer)(z / (long)pPVar43);
          if (z / (long)pPVar43 <= (long)pPVar43) {
            pPVar35 = pPVar43;
          }
          local_f8 = (pointer)z;
          if ((long)pPVar51 < z) {
            local_f8 = pPVar51;
          }
          if ((long)pPVar51 < (long)pPVar35) {
            local_f8 = pPVar35;
          }
          pPVar51 = (pointer)z;
          if ((long)pPVar34 < z) {
            pPVar51 = pPVar34;
          }
          if ((long)pPVar34 < (long)pPVar35) {
            pPVar51 = pPVar35;
          }
          uVar50 = uVar36 >> 2 & 0xfffffffffffffff0;
          lVar48 = POPCOUNT((ulong)(*(long *)((long)&(local_90.pi_.
                                                                                                            
                                                  super__Vector_base<primesum::PiTable::PiData,_std::allocator<primesum::PiTable::PiData>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->bits +
                                             uVar50) << (~(byte)uVar36 & 0x3f)) >>
                            (~(byte)uVar36 & 0x3f)) +
                   *(long *)((long)&(local_90.pi_.
                                     super__Vector_base<primesum::PiTable::PiData,_std::allocator<primesum::PiTable::PiData>_>
                                     ._M_impl.super__Vector_impl_data._M_start)->prime_count +
                            uVar50);
          uVar50 = (ulong)local_f8 >> 2 & 0xfffffffffffffff0;
          local_100 = (pointer)(POPCOUNT((ulong)(*(long *)((long)&(local_90.pi_.
                                                                                                                                      
                                                  super__Vector_base<primesum::PiTable::PiData,_std::allocator<primesum::PiTable::PiData>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->bits +
                                                  uVar50) << (~(byte)local_f8 & 0x3f)) >>
                                         (~(byte)local_f8 & 0x3f)) +
                               *(long *)((long)&(local_90.pi_.
                                                 super__Vector_base<primesum::PiTable::PiData,_std::allocator<primesum::PiTable::PiData>_>
                                                 ._M_impl.super__Vector_impl_data._M_start)->
                                                prime_count + uVar50));
          uVar50 = (ulong)pPVar51 >> 2 & 0xfffffffffffffff0;
          local_178 = POPCOUNT((ulong)(*(long *)((long)&(local_90.pi_.
                                                                                                                  
                                                  super__Vector_base<primesum::PiTable::PiData,_std::allocator<primesum::PiTable::PiData>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->bits +
                                                uVar50) << (~(byte)pPVar51 & 0x3f)) >>
                               (~(byte)pPVar51 & 0x3f)) +
                      *(long *)((long)&(local_90.pi_.
                                        super__Vector_base<primesum::PiTable::PiData,_std::allocator<primesum::PiTable::PiData>_>
                                        ._M_impl.super__Vector_impl_data._M_start)->prime_count +
                               uVar50);
          lVar46 = lVar48;
          local_170 = uVar41 + 1;
          if ((long)local_100 < lVar48) {
            do {
              plVar31 = local_138.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                        super__Vector_impl_data._M_start;
              uVar50 = (ulong)*(uint *)((long)local_138.
                                              super__Vector_base<long,_std::allocator<long>_>.
                                              _M_impl.super__Vector_impl_data._M_start + lVar46 * 4)
              ;
              if (uVar38 == 0) {
                uVar50 = uVar39 / uVar50;
              }
              else {
                uVar50 = __udivti3(uVar39,uVar38,uVar50,0);
              }
              pPVar51 = local_90.pi_.
                        super__Vector_base<primesum::PiTable::PiData,_std::allocator<primesum::PiTable::PiData>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              uVar33 = 0xffffffffffffffff >> (~(byte)uVar50 & 0x3f);
              uVar50 = uVar50 >> 2 & 0xfffffffffffffff0;
              local_b8.low._0_8_ =
                   (*(long *)((long)local_f0.super__Vector_base<__int128,_std::allocator<__int128>_>
                                    ._M_impl.super__Vector_impl_data._M_start +
                             (POPCOUNT(uVar33 & *(ulong *)((long)&(local_90.pi_.
                                                                                                                                      
                                                  super__Vector_base<primesum::PiTable::PiData,_std::allocator<primesum::PiTable::PiData>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->bits +
                                                  uVar50)) +
                             *(long *)((long)&(local_90.pi_.
                                               super__Vector_base<primesum::PiTable::PiData,_std::allocator<primesum::PiTable::PiData>_>
                                               ._M_impl.super__Vector_impl_data._M_start)->
                                              prime_count + uVar50)) * 8) -
                   *(long *)((long)local_f0.super__Vector_base<__int128,_std::allocator<__int128>_>.
                                   _M_impl.super__Vector_impl_data._M_start + uVar41 * 8)) + 1;
              local_b8.low._8_8_ = 0;
              local_b8.high._0_8_ = 0;
              local_b8.high._8_8_ = 0;
              uVar50 = (ulong)*(uint *)((long)plVar31 +
                                       *(long *)((long)&(local_90.pi_.
                                                                                                                  
                                                  super__Vector_base<primesum::PiTable::PiData,_std::allocator<primesum::PiTable::PiData>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->
                                                  prime_count + uVar50) * 4 +
                                       POPCOUNT(*(ulong *)((long)&(local_90.pi_.
                                                                                                                                      
                                                  super__Vector_base<primesum::PiTable::PiData,_std::allocator<primesum::PiTable::PiData>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->bits +
                                                  uVar50) & uVar33) * 4 + 4);
              local_168 = uVar40;
              if (uVar38 == 0) {
                pPVar35 = (pointer)(uVar39 / uVar50);
              }
              else {
                pPVar35 = (pointer)__udivti3(uVar39,uVar38,uVar50,0);
              }
              if ((long)pPVar35 <= (long)local_f8) {
                pPVar35 = local_f8;
              }
              uVar40 = (ulong)pPVar35 >> 2 & 0xfffffffffffffff0;
              lVar48 = POPCOUNT((ulong)(*(long *)((long)&pPVar51->bits + uVar40) <<
                                       (~(byte)pPVar35 & 0x3f)) >> (~(byte)pPVar35 & 0x3f)) +
                       *(long *)((long)&pPVar51->prime_count + uVar40);
              local_190 = (pointer)0x0;
              pPStack_188 = (pointer)0x0;
              local_180 = (pointer)0x0;
              local_198 = pPVar43;
              int256_t::operator*(&local_58,&local_b8,(int256_t *)&local_198);
              local_198 = (pointer)(*(long *)((long)local_f0.
                                                  super__Vector_base<__int128,_std::allocator<__int128>_>
                                                  ._M_impl.super__Vector_impl_data._M_start +
                                             lVar46 * 8) -
                                   *(long *)((long)local_f0.
                                                  super__Vector_base<__int128,_std::allocator<__int128>_>
                                                  ._M_impl.super__Vector_impl_data._M_start +
                                            lVar48 * 8));
              local_190 = (pointer)0x0;
              pPStack_188 = (pointer)0x0;
              local_180 = (pointer)0x0;
              int256_t::operator*(&local_d8,&local_58,(int256_t *)&local_198);
              bVar52 = CARRY8(uVar42,(ulong)local_d8.high);
              uVar33 = uVar42 + (ulong)local_d8.high;
              bVar53 = CARRY8(uVar49,(ulong)local_d8.low);
              uVar49 = uVar49 + (ulong)local_d8.low;
              uVar40 = local_168 + local_d8.low._8_8_ + (ulong)bVar53;
              uVar50 = (ulong)(CARRY8(local_168,local_d8.low._8_8_) ||
                              CARRY8(local_168 + local_d8.low._8_8_,(ulong)bVar53));
              uVar42 = uVar33 + uVar50;
              lVar47 = lVar47 + local_d8.high._8_8_ + (ulong)bVar52 + (ulong)CARRY8(uVar33,uVar50);
              lVar46 = lVar48;
            } while ((long)local_100 < lVar48);
          }
          if ((long)local_178 < lVar48) {
            do {
              plVar31 = local_138.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                        super__Vector_impl_data._M_start;
              uVar50 = (ulong)*(uint *)((long)local_138.
                                              super__Vector_base<long,_std::allocator<long>_>.
                                              _M_impl.super__Vector_impl_data._M_start + lVar48 * 4)
              ;
              if (uVar38 == 0) {
                uVar50 = uVar39 / uVar50;
              }
              else {
                uVar50 = __udivti3(uVar39,uVar38,uVar50,0);
              }
              uVar33 = uVar50 >> 2 & 0xfffffffffffffff0;
              local_b8.low._0_8_ =
                   (*(long *)((long)local_f0.super__Vector_base<__int128,_std::allocator<__int128>_>
                                    ._M_impl.super__Vector_impl_data._M_start +
                             (POPCOUNT((ulong)(*(long *)((long)&(local_90.pi_.
                                                                                                                                  
                                                  super__Vector_base<primesum::PiTable::PiData,_std::allocator<primesum::PiTable::PiData>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->bits +
                                                  uVar33) << (~(byte)uVar50 & 0x3f)) >>
                                       (~(byte)uVar50 & 0x3f)) +
                             *(long *)((long)&(local_90.pi_.
                                               super__Vector_base<primesum::PiTable::PiData,_std::allocator<primesum::PiTable::PiData>_>
                                               ._M_impl.super__Vector_impl_data._M_start)->
                                              prime_count + uVar33)) * 8) -
                   *(long *)((long)local_f0.super__Vector_base<__int128,_std::allocator<__int128>_>.
                                   _M_impl.super__Vector_impl_data._M_start + uVar41 * 8)) + 1;
              local_b8.low._8_8_ = 0;
              local_b8.high._0_8_ = 0;
              local_b8.high._8_8_ = 0;
              local_198 = (pointer)((ulong)*(uint *)((long)plVar31 + lVar48 * 4) * (long)pPVar43);
              local_190 = (pointer)0x0;
              pPStack_188 = (pointer)0x0;
              local_180 = (pointer)0x0;
              int256_t::operator*(&local_d8,&local_b8,(int256_t *)&local_198);
              bVar52 = CARRY8(uVar42,(ulong)local_d8.high);
              uVar33 = uVar42 + (ulong)local_d8.high;
              bVar53 = CARRY8(uVar49,(ulong)local_d8.low);
              uVar49 = uVar49 + (ulong)local_d8.low;
              bVar54 = CARRY8(uVar40,local_d8.low._8_8_);
              uVar42 = uVar40 + local_d8.low._8_8_;
              uVar40 = uVar42 + bVar53;
              uVar50 = (ulong)(bVar54 || CARRY8(uVar42,(ulong)bVar53));
              uVar42 = uVar33 + uVar50;
              lVar47 = lVar47 + local_d8.high._8_8_ + (ulong)bVar52 + (ulong)CARRY8(uVar33,uVar50);
              lVar48 = lVar48 + -1;
            } while ((long)local_178 < lVar48);
          }
          bVar52 = is_print();
          lVar46 = local_110;
          uVar41 = local_170;
          if (bVar52) {
            n_00._8_8_ = in_stack_fffffffffffffe10;
            n_00._0_8_ = in_stack_fffffffffffffe08;
            limit_00._8_8_ = in_stack_fffffffffffffe20;
            limit_00._0_8_ = in_stack_fffffffffffffe18;
            S2Status::print((S2Status *)local_160,(int128_t)n_00,(int128_t)limit_00);
          }
        } while ((long)uVar41 < lVar46);
      }
      auVar26._8_8_ = uVar40;
      auVar26._0_8_ = uVar49;
      auVar25._8_8_ = uVar40;
      auVar25._0_8_ = uVar49;
      if (local_90.pi_.
          super__Vector_base<primesum::PiTable::PiData,_std::allocator<primesum::PiTable::PiData>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_90.pi_.
                        super__Vector_base<primesum::PiTable::PiData,_std::allocator<primesum::PiTable::PiData>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_90.pi_.
                              super__Vector_base<primesum::PiTable::PiData,_std::allocator<primesum::PiTable::PiData>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_90.pi_.
                              super__Vector_base<primesum::PiTable::PiData,_std::allocator<primesum::PiTable::PiData>_>
                              ._M_impl.super__Vector_impl_data._M_start);
        auVar25 = auVar26;
      }
    }
    local_118->low = (uint128_t)auVar25;
    *(ulong *)&local_118->high = uVar42;
    *(long *)((long)&local_118->high + 8) = lVar47;
  }
  else {
    generate_primes<long>(&local_138,z);
    generate_prime_sums<__int128>(&local_f0,z);
    dVar56 = (double)__floatuntidf(this,y);
    dVar56 = pow(dVar56,0.3333333333333333);
    auVar57 = __fixunsdfti(SUB84(dVar56,0));
    if (auVar57._0_8_ != 0 || auVar57._8_8_ != 0) {
      do {
        lVar47 = auVar57._0_8_;
        iVar44 = 2;
        auVar60 = ZEXT816(1);
        do {
          auVar60 = auVar57 * auVar60;
          iVar44 = iVar44 + -1;
        } while (iVar44 != 0);
        auVar58 = __udivti3(this,y,lVar47,auVar57._8_8_);
        if (auVar60._8_8_ <= auVar58._8_8_ &&
            (ulong)(auVar58._0_8_ < auVar60._0_8_) <= auVar58._8_8_ - auVar60._8_8_)
        goto LAB_00123201;
        lVar46 = auVar57._8_8_ + -1 + (ulong)(lVar47 != 0);
        auVar57._8_8_ = lVar46;
        auVar57._0_8_ = lVar47 + -1;
      } while (lVar47 + -1 != 0 || lVar46 != 0);
      auVar57 = ZEXT816(0);
    }
LAB_00123201:
    do {
      auVar60 = auVar57;
      uVar49 = auVar60._0_8_;
      uVar50 = uVar49 + 1;
      lVar47 = auVar60._8_8_ + (ulong)(0xfffffffffffffffe < uVar49);
      auVar57._8_8_ = lVar47;
      auVar57._0_8_ = uVar50;
      iVar44 = 2;
      uVar40 = 0;
      uVar41 = 1;
      do {
        auVar2._8_8_ = 0;
        auVar2._0_8_ = uVar41;
        auVar13._8_8_ = 0;
        auVar13._0_8_ = uVar50;
        uVar33 = SUB168(auVar2 * auVar13,0);
        uVar40 = uVar40 * uVar50 + uVar41 * lVar47 + SUB168(auVar2 * auVar13,8);
        iVar44 = iVar44 + -1;
        uVar41 = uVar33;
      } while (iVar44 != 0);
      auVar58 = __udivti3(this,y,uVar50,lVar47);
    } while (uVar40 <= auVar58._8_8_ && (ulong)(auVar58._0_8_ < uVar33) <= auVar58._8_8_ - uVar40);
    ideal_num_threads((int)x,uVar49,1000);
    PiTable::PiTable(&local_90,z);
    dVar56 = (double)z;
    if (dVar56 < 0.0) {
      dVar56 = sqrt(dVar56);
    }
    else {
      dVar56 = SQRT(dVar56);
    }
    uVar41 = 0xb504f333;
    if ((long)dVar56 < 0xb504f333) {
      uVar41 = (long)dVar56;
    }
    lVar47 = uVar41 * 2;
    do {
      lVar46 = uVar41 * uVar41;
      uVar41 = uVar41 - 1;
      lVar47 = lVar47 + -2;
    } while (lVar46 - z != 0 && z <= lVar46);
    do {
      uVar41 = uVar41 + 1;
      lVar47 = lVar47 + 2;
    } while (lVar47 < (long)(z - uVar41 * uVar41));
    uVar40 = uVar41 >> 2 & 0xfffffffffffffff0;
    lVar47 = *(long *)((long)&(local_90.pi_.
                               super__Vector_base<primesum::PiTable::PiData,_std::allocator<primesum::PiTable::PiData>_>
                               ._M_impl.super__Vector_impl_data._M_start)->prime_count + uVar40);
    uVar49 = uVar49 >> 2 & 0xfffffffffffffff0;
    lVar46 = *(long *)((long)&(local_90.pi_.
                               super__Vector_base<primesum::PiTable::PiData,_std::allocator<primesum::PiTable::PiData>_>
                               ._M_impl.super__Vector_impl_data._M_start)->bits + uVar40);
    lVar48 = POPCOUNT((ulong)(*(long *)((long)&(local_90.pi_.
                                                super__Vector_base<primesum::PiTable::PiData,_std::allocator<primesum::PiTable::PiData>_>
                                                ._M_impl.super__Vector_impl_data._M_start)->bits +
                                       uVar49) << (~auVar60[0] & 0x3f)) >> (~auVar60[0] & 0x3f)) +
             *(long *)((long)&(local_90.pi_.
                               super__Vector_base<primesum::PiTable::PiData,_std::allocator<primesum::PiTable::PiData>_>
                               ._M_impl.super__Vector_impl_data._M_start)->prime_count + uVar49);
    x_00._8_8_ = in_stack_fffffffffffffe10;
    x_00._0_8_ = in_stack_fffffffffffffe08;
    S2Status::S2Status((S2Status *)local_160,(int128_t)x_00);
    uVar41 = POPCOUNT((ulong)(lVar46 << (~(byte)uVar41 & 0x3f)) >> (~(byte)uVar41 & 0x3f)) + lVar47;
    if ((long)uVar41 <= (long)uVar42) {
      uVar41 = uVar42;
    }
    uVar40 = 0;
    uVar42 = 0;
    lVar47 = 0;
    uVar49 = 0;
    if ((long)uVar41 < lVar48) {
      local_120 = lVar48 >> 0x3f;
      uVar42 = 0;
      lVar47 = 0;
      uVar49 = 0;
      uVar40 = 0;
      local_110 = lVar48;
      do {
        pPVar43 = (pointer)local_138.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                           super__Vector_impl_data._M_start[uVar41 + 1];
        pPVar51 = (pointer)((long)pPVar43 >> 0x3f);
        auVar60 = __udivti3(this,y,pPVar43,pPVar51);
        uVar39 = auVar60._8_8_;
        uVar36 = auVar60._0_8_;
        local_f8 = pPVar51;
        auVar58 = __udivti3(uVar36,uVar39,pPVar43,pPVar51);
        uVar50 = (ulong)(auVar58._0_8_ < (ulong)z);
        uVar33 = auVar58._0_8_;
        if (uVar50 <= auVar58._8_8_) {
          uVar33 = z;
        }
        dVar56 = (double)__floatuntidf(uVar36,uVar39,auVar58._8_8_ - uVar50);
        if (dVar56 < 0.0) {
          dVar56 = sqrt(dVar56);
          uVar55 = SUB84(dVar56,0);
        }
        else {
          uVar55 = SUB84(SQRT(dVar56),0);
        }
        auVar58 = __fixunsdfti(uVar55);
        lVar46 = 0;
        pPVar51 = (pointer)(-(ulong)(auVar58._8_8_ != 0) | auVar58._0_8_);
        do {
          lVar48 = lVar46;
          auVar4._8_8_ = 0;
          auVar4._0_8_ = pPVar51;
          auVar16._8_8_ = 0;
          auVar16._0_8_ = pPVar51;
          uVar50 = SUB168(auVar4 * auVar16,8) + (long)pPVar51 * lVar48 * 2;
          pPVar35 = pPVar51;
          lVar46 = lVar48 + -1 + (ulong)(pPVar51 != (pointer)0x0);
          pPVar51 = (pointer)((long)&pPVar51[-1].bits + 7);
        } while (uVar39 < uVar50 || uVar39 - uVar50 < (ulong)(uVar36 < SUB168(auVar4 * auVar16,0)));
        do {
          pPVar51 = pPVar35;
          auVar5._8_8_ = 0;
          auVar5._0_8_ = pPVar51;
          auVar17._8_8_ = 0;
          auVar17._0_8_ = pPVar51;
          auVar28._8_8_ = SUB168(auVar5 * auVar17,8) + (long)pPVar51 * lVar48 * 2;
          auVar28._0_8_ = SUB168(auVar5 * auVar17,0);
          uVar50 = SUB168(auVar60 - auVar28,8);
          uVar38 = lVar48 << 1 | (ulong)pPVar51 >> 0x3f;
          lVar48 = lVar48 + (ulong)((pointer)0xfffffffffffffffe < pPVar51);
          pPVar35 = (pointer)((long)&pPVar51->prime_count + 1);
        } while (uVar38 < uVar50 ||
                 uVar38 - uVar50 < (ulong)((ulong)((long)pPVar51 * 2) < SUB168(auVar60 - auVar28,0))
                );
        pPVar34 = (pointer)(local_70 / (long)pPVar43);
        pPVar35 = (pointer)(z / (long)pPVar43);
        if (z / (long)pPVar43 <= (long)pPVar43) {
          pPVar35 = pPVar43;
        }
        local_100 = (pointer)z;
        if ((long)pPVar51 < z) {
          local_100 = pPVar51;
        }
        if ((long)pPVar51 < (long)pPVar35) {
          local_100 = pPVar35;
        }
        pPVar51 = (pointer)z;
        if ((long)pPVar34 < z) {
          pPVar51 = pPVar34;
        }
        if ((long)pPVar34 < (long)pPVar35) {
          pPVar51 = pPVar35;
        }
        uVar50 = uVar33 >> 2 & 0xfffffffffffffff0;
        lVar48 = POPCOUNT((ulong)(*(long *)((long)&(local_90.pi_.
                                                                                                        
                                                  super__Vector_base<primesum::PiTable::PiData,_std::allocator<primesum::PiTable::PiData>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->bits +
                                           uVar50) << (~(byte)uVar33 & 0x3f)) >>
                          (~(byte)uVar33 & 0x3f)) +
                 *(long *)((long)&(local_90.pi_.
                                   super__Vector_base<primesum::PiTable::PiData,_std::allocator<primesum::PiTable::PiData>_>
                                   ._M_impl.super__Vector_impl_data._M_start)->prime_count + uVar50)
        ;
        uVar50 = (ulong)local_100 >> 2 & 0xfffffffffffffff0;
        local_170 = POPCOUNT((ulong)(*(long *)((long)&(local_90.pi_.
                                                                                                              
                                                  super__Vector_base<primesum::PiTable::PiData,_std::allocator<primesum::PiTable::PiData>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->bits +
                                              uVar50) << (~(byte)local_100 & 0x3f)) >>
                             (~(byte)local_100 & 0x3f)) +
                    *(long *)((long)&(local_90.pi_.
                                      super__Vector_base<primesum::PiTable::PiData,_std::allocator<primesum::PiTable::PiData>_>
                                      ._M_impl.super__Vector_impl_data._M_start)->prime_count +
                             uVar50);
        uVar50 = (ulong)pPVar51 >> 2 & 0xfffffffffffffff0;
        local_178 = POPCOUNT((ulong)(*(long *)((long)&(local_90.pi_.
                                                                                                              
                                                  super__Vector_base<primesum::PiTable::PiData,_std::allocator<primesum::PiTable::PiData>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->bits +
                                              uVar50) << (~(byte)pPVar51 & 0x3f)) >>
                             (~(byte)pPVar51 & 0x3f)) +
                    *(long *)((long)&(local_90.pi_.
                                      super__Vector_base<primesum::PiTable::PiData,_std::allocator<primesum::PiTable::PiData>_>
                                      ._M_impl.super__Vector_impl_data._M_start)->prime_count +
                             uVar50);
        lVar46 = lVar48;
        local_108 = uVar41 + 1;
        if ((long)local_170 < lVar48) {
          do {
            plVar31 = local_138.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                      super__Vector_impl_data._M_start;
            uVar50 = local_138.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                     super__Vector_impl_data._M_start[lVar46];
            if (uVar39 == 0) {
              uVar50 = uVar36 / uVar50;
            }
            else {
              uVar50 = __udivti3(uVar36,uVar39,uVar50,(long)uVar50 >> 0x3f);
            }
            pPVar51 = local_90.pi_.
                      super__Vector_base<primesum::PiTable::PiData,_std::allocator<primesum::PiTable::PiData>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            uVar38 = 0xffffffffffffffff >> (~(byte)uVar50 & 0x3f);
            uVar33 = uVar50 >> 2 & 0xfffffffffffffff0;
            uVar37 = (int)POPCOUNT(uVar38 & *(ulong *)((long)&(local_90.pi_.
                                                                                                                              
                                                  super__Vector_base<primesum::PiTable::PiData,_std::allocator<primesum::PiTable::PiData>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->bits +
                                                  uVar33)) << 4;
            lVar48 = *(long *)((long)&(local_90.pi_.
                                       super__Vector_base<primesum::PiTable::PiData,_std::allocator<primesum::PiTable::PiData>_>
                                       ._M_impl.super__Vector_impl_data._M_start)->prime_count +
                              uVar33) * 0x10;
            uVar50 = *(ulong *)((long)local_f0.
                                      super__Vector_base<__int128,_std::allocator<__int128>_>.
                                      _M_impl.super__Vector_impl_data._M_start +
                               lVar48 + (ulong)uVar37);
            uVar45 = uVar50 - *(ulong *)(local_f0.
                                         super__Vector_base<__int128,_std::allocator<__int128>_>.
                                         _M_impl.super__Vector_impl_data._M_start + uVar41);
            local_b8.low._0_8_ = uVar45 + 1;
            local_b8.low._8_8_ =
                 ((*(long *)((long)local_f0.super__Vector_base<__int128,_std::allocator<__int128>_>.
                                   _M_impl.super__Vector_impl_data._M_start +
                            lVar48 + 8 + (ulong)uVar37) -
                  *(long *)((long)local_f0.super__Vector_base<__int128,_std::allocator<__int128>_>.
                                  _M_impl.super__Vector_impl_data._M_start + (uVar41 * 2 + 1) * 8))
                 - (ulong)(uVar50 < *(ulong *)(local_f0.
                                               super__Vector_base<__int128,_std::allocator<__int128>_>
                                               ._M_impl.super__Vector_impl_data._M_start + uVar41)))
                 + (ulong)(0xfffffffffffffffe < uVar45);
            local_b8.high._0_8_ = local_b8.low._8_8_ >> 0x3f;
            uVar50 = plVar31[POPCOUNT(*(ulong *)((long)&(local_90.pi_.
                                                                                                                  
                                                  super__Vector_base<primesum::PiTable::PiData,_std::allocator<primesum::PiTable::PiData>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->bits +
                                                uVar33) & uVar38) +
                             *(long *)((long)&(local_90.pi_.
                                               super__Vector_base<primesum::PiTable::PiData,_std::allocator<primesum::PiTable::PiData>_>
                                               ._M_impl.super__Vector_impl_data._M_start)->
                                              prime_count + uVar33) + 1];
            local_168 = uVar40;
            local_b8.high._8_8_ = (long)local_b8.high;
            if (uVar39 == 0) {
              pPVar35 = (pointer)(uVar36 / uVar50);
            }
            else {
              pPVar35 = (pointer)__udivti3(uVar36,uVar39,uVar50,(long)uVar50 >> 0x3f);
            }
            if ((long)pPVar35 <= (long)local_100) {
              pPVar35 = local_100;
            }
            uVar40 = (ulong)pPVar35 >> 2 & 0xfffffffffffffff0;
            lVar48 = POPCOUNT((ulong)(*(long *)((long)&pPVar51->bits + uVar40) <<
                                     (~(byte)pPVar35 & 0x3f)) >> (~(byte)pPVar35 & 0x3f)) +
                     *(long *)((long)&pPVar51->prime_count + uVar40);
            local_190 = local_f8;
            local_180 = local_f8;
            pPStack_188 = local_f8;
            local_198 = pPVar43;
            int256_t::operator*(&local_58,&local_b8,(int256_t *)&local_198);
            local_198 = (pointer)(*(ulong *)(local_f0.
                                             super__Vector_base<__int128,_std::allocator<__int128>_>
                                             ._M_impl.super__Vector_impl_data._M_start + lVar46) -
                                 *(ulong *)(local_f0.
                                            super__Vector_base<__int128,_std::allocator<__int128>_>.
                                            _M_impl.super__Vector_impl_data._M_start + lVar48));
            local_190 = (pointer)((*(long *)((long)local_f0.
                                                  super__Vector_base<__int128,_std::allocator<__int128>_>
                                                  ._M_impl.super__Vector_impl_data._M_start +
                                            (lVar46 * 2 + 1) * 8) -
                                  *(long *)((long)local_f0.
                                                  super__Vector_base<__int128,_std::allocator<__int128>_>
                                                  ._M_impl.super__Vector_impl_data._M_start +
                                           (lVar48 * 2 + 1) * 8)) -
                                 (ulong)(*(ulong *)(local_f0.
                                                  super__Vector_base<__int128,_std::allocator<__int128>_>
                                                  ._M_impl.super__Vector_impl_data._M_start + lVar46
                                                  ) <
                                        *(ulong *)(local_f0.
                                                  super__Vector_base<__int128,_std::allocator<__int128>_>
                                                  ._M_impl.super__Vector_impl_data._M_start + lVar48
                                                  )));
            pPStack_188 = (pointer)((long)local_190 >> 0x3f);
            local_180 = pPStack_188;
            int256_t::operator*(&local_d8,&local_58,(int256_t *)&local_198);
            bVar52 = CARRY8(uVar42,(ulong)local_d8.high);
            uVar33 = uVar42 + (ulong)local_d8.high;
            bVar53 = CARRY8(uVar49,(ulong)local_d8.low);
            uVar49 = uVar49 + (ulong)local_d8.low;
            uVar40 = local_168 + local_d8.low._8_8_ + (ulong)bVar53;
            uVar50 = (ulong)(CARRY8(local_168,local_d8.low._8_8_) ||
                            CARRY8(local_168 + local_d8.low._8_8_,(ulong)bVar53));
            uVar42 = uVar33 + uVar50;
            lVar47 = lVar47 + local_d8.high._8_8_ + (ulong)bVar52 + (ulong)CARRY8(uVar33,uVar50);
            lVar46 = lVar48;
          } while ((long)local_170 < lVar48);
        }
        if ((long)local_178 < lVar48) {
          do {
            plVar31 = local_138.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                      super__Vector_impl_data._M_start;
            uVar50 = local_138.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                     super__Vector_impl_data._M_start[lVar48];
            if (uVar39 == 0) {
              uVar50 = uVar36 / uVar50;
            }
            else {
              uVar50 = __udivti3(uVar36,uVar39,uVar50,(long)uVar50 >> 0x3f);
            }
            uVar33 = uVar50 >> 2 & 0xfffffffffffffff0;
            uVar37 = (int)POPCOUNT((ulong)(*(long *)((long)&(local_90.pi_.
                                                                                                                          
                                                  super__Vector_base<primesum::PiTable::PiData,_std::allocator<primesum::PiTable::PiData>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->bits +
                                                  uVar33) << (~(byte)uVar50 & 0x3f)) >>
                                   (~(byte)uVar50 & 0x3f)) << 4;
            lVar46 = *(long *)((long)&(local_90.pi_.
                                       super__Vector_base<primesum::PiTable::PiData,_std::allocator<primesum::PiTable::PiData>_>
                                       ._M_impl.super__Vector_impl_data._M_start)->prime_count +
                              uVar33) * 0x10;
            uVar50 = *(ulong *)((long)local_f0.
                                      super__Vector_base<__int128,_std::allocator<__int128>_>.
                                      _M_impl.super__Vector_impl_data._M_start +
                               lVar46 + (ulong)uVar37);
            uVar33 = uVar50 - *(ulong *)(local_f0.
                                         super__Vector_base<__int128,_std::allocator<__int128>_>.
                                         _M_impl.super__Vector_impl_data._M_start + uVar41);
            local_b8.low._0_8_ = uVar33 + 1;
            local_b8.low._8_8_ =
                 ((*(long *)((long)local_f0.super__Vector_base<__int128,_std::allocator<__int128>_>.
                                   _M_impl.super__Vector_impl_data._M_start +
                            lVar46 + 8 + (ulong)uVar37) -
                  *(long *)((long)local_f0.super__Vector_base<__int128,_std::allocator<__int128>_>.
                                  _M_impl.super__Vector_impl_data._M_start + (uVar41 * 2 + 1) * 8))
                 - (ulong)(uVar50 < *(ulong *)(local_f0.
                                               super__Vector_base<__int128,_std::allocator<__int128>_>
                                               ._M_impl.super__Vector_impl_data._M_start + uVar41)))
                 + (ulong)(0xfffffffffffffffe < uVar33);
            local_b8.high._0_8_ = local_b8.low._8_8_ >> 0x3f;
            local_198 = (pointer)((long)pPVar43 * plVar31[lVar48]);
            local_190 = SUB168(SEXT816((long)pPVar43) * SEXT816(plVar31[lVar48]),8);
            pPStack_188 = (pointer)((long)local_190 >> 0x3f);
            local_180 = pPStack_188;
            local_b8.high._8_8_ = (long)local_b8.high;
            int256_t::operator*(&local_d8,&local_b8,(int256_t *)&local_198);
            bVar52 = CARRY8(uVar42,(ulong)local_d8.high);
            uVar33 = uVar42 + (ulong)local_d8.high;
            bVar53 = CARRY8(uVar49,(ulong)local_d8.low);
            uVar49 = uVar49 + (ulong)local_d8.low;
            bVar54 = CARRY8(uVar40,local_d8.low._8_8_);
            uVar42 = uVar40 + local_d8.low._8_8_;
            uVar40 = uVar42 + bVar53;
            uVar50 = (ulong)(bVar54 || CARRY8(uVar42,(ulong)bVar53));
            uVar42 = uVar33 + uVar50;
            lVar47 = lVar47 + local_d8.high._8_8_ + (ulong)bVar52 + (ulong)CARRY8(uVar33,uVar50);
            lVar48 = lVar48 + -1;
          } while ((long)local_178 < lVar48);
        }
        bVar52 = is_print();
        uVar41 = local_108;
        lVar46 = local_110;
        if (bVar52) {
          n._8_8_ = in_stack_fffffffffffffe10;
          n._0_8_ = in_stack_fffffffffffffe08;
          limit._8_8_ = in_stack_fffffffffffffe20;
          limit._0_8_ = in_stack_fffffffffffffe18;
          S2Status::print((S2Status *)local_160,(int128_t)n,(int128_t)limit);
        }
      } while ((long)uVar41 < lVar46);
    }
    if (local_90.pi_.
        super__Vector_base<primesum::PiTable::PiData,_std::allocator<primesum::PiTable::PiData>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_90.pi_.
                      super__Vector_base<primesum::PiTable::PiData,_std::allocator<primesum::PiTable::PiData>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_90.pi_.
                            super__Vector_base<primesum::PiTable::PiData,_std::allocator<primesum::PiTable::PiData>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_90.pi_.
                            super__Vector_base<primesum::PiTable::PiData,_std::allocator<primesum::PiTable::PiData>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    *(ulong *)&local_118->low = uVar49;
    *(ulong *)((long)&local_118->low + 8) = uVar40;
    *(ulong *)&local_118->high = uVar42;
    *(long *)((long)&local_118->high + 8) = lVar47;
  }
  if (local_f0.super__Vector_base<__int128,_std::allocator<__int128>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_f0.super__Vector_base<__int128,_std::allocator<__int128>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_f0.super__Vector_base<__int128,_std::allocator<__int128>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_f0.super__Vector_base<__int128,_std::allocator<__int128>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_138.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_138.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_138.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_138.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  local_160._0_8_ = local_160 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_160,"S2_easy","");
  print((string *)local_160,*local_118,local_68);
  if ((undefined1 *)local_160._0_8_ != local_160 + 0x10) {
    operator_delete((void *)local_160._0_8_,local_160._16_8_ + 1);
  }
  return local_118;
}

Assistant:

int256_t S2_easy(int128_t x,
                 int64_t y,
                 int64_t z,
                 int64_t c,
                 int threads)
{
  print("");
  print("=== S2_easy(x, y) ===");
  print("Computation of the easy special leaves");
  print(x, y, c, threads);

  double time = get_time();
  int256_t s2_easy;

  // uses less memory
  if (y <= numeric_limits<uint32_t>::max())
  {
    auto primes = generate_primes<uint32_t>(y);
    auto prime_sums = generate_prime_sums<uint64_t>(y);

    if (x <= numeric_limits<uint64_t>::max())
      s2_easy = S2_easy_OpenMP<int128_t>(x, y, z, c, primes, prime_sums, threads);
    else
      s2_easy = S2_easy_OpenMP<int256_t>(x, y, z, c, primes, prime_sums, threads);
  }
  else
  {
    auto primes = generate_primes<int64_t>(y);
    auto prime_sums = generate_prime_sums<int128_t>(y);

    s2_easy = S2_easy_OpenMP<int256_t>(x, y, z, c, primes, prime_sums, threads);
  }

  print("S2_easy", s2_easy, time);
  return s2_easy;
}